

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DebugDirWrapper.cpp
# Opt level: O1

QString * __thiscall
DebugDirCVEntryWrapper::getFieldName
          (QString *__return_storage_ptr__,DebugDirCVEntryWrapper *this,size_t fId)

{
  storage_type *psVar1;
  QByteArrayView QVar2;
  QByteArrayView QVar3;
  Data *local_30;
  char16_t *local_28;
  qsizetype local_20;
  
  switch(fId) {
  case 0:
    psVar1 = (storage_type *)0x5;
    break;
  case 1:
    psVar1 = (storage_type *)0x9;
    break;
  case 2:
    goto LAB_00133727;
  case 3:
LAB_00133727:
    psVar1 = (storage_type *)0x3;
    break;
  default:
    QVar3.m_data = (storage_type *)0x0;
    QVar3.m_size = (qsizetype)&local_30;
    QString::fromUtf8(QVar3);
    (__return_storage_ptr__->d).size = 0;
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).d = local_30;
    goto LAB_00133761;
  }
  QVar2.m_data = psVar1;
  QVar2.m_size = (qsizetype)&local_30;
  QString::fromUtf8(QVar2);
  (__return_storage_ptr__->d).size = 0;
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).d = local_30;
LAB_00133761:
  (__return_storage_ptr__->d).ptr = local_28;
  (__return_storage_ptr__->d).size = local_20;
  return __return_storage_ptr__;
}

Assistant:

QString DebugDirCVEntryWrapper::getFieldName(size_t fId)
{
    switch (fId) {
        case F_CVDBG_SIGN: return "CvSig";
        case F_CVDBG_GUID: return "Signature";
        case F_CVDBG_AGE: return "Age";
        case F_CVDBG_PDB: return "PDB";
    }
    return "";
}